

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_barriers.cpp
# Opt level: O0

spv_result_t spvtools::val::BarriersPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  spv_result_t sVar4;
  Function *pFVar5;
  DiagnosticStream *pDVar6;
  spv_result_t error_6;
  spv_result_t error_5;
  uint32_t memory_scope_2;
  DiagnosticStream local_618;
  uint32_t local_43c;
  char *pcStack_438;
  uint32_t named_barrier_type;
  DiagnosticStream local_430;
  uint32_t local_254;
  char *pcStack_250;
  uint32_t subgroup_count_type;
  DiagnosticStream local_248;
  spv_result_t local_68;
  spv_result_t error_4;
  spv_result_t error_3;
  uint32_t memory_scope_1;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  uint32_t memory_scope;
  uint32_t execution_scope;
  uint32_t local_28;
  Op local_24;
  uint32_t result_type;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _result_type = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::opcode(inst);
  local_28 = Instruction::type_id(_result_type);
  if (local_24 == OpControlBarrier) {
    uVar3 = ValidationState_t::version((ValidationState_t *)inst_local);
    this = inst_local;
    if (uVar3 < 0x10300) {
      pFVar5 = Instruction::function(_result_type);
      uVar3 = Function::id(pFVar5);
      pFVar5 = ValidationState_t::function((ValidationState_t *)this,uVar3);
      std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
      function<spvtools::val::BarriersPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0,void>
                ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&execution_scope,
                 (anon_class_1_0_00000001 *)((long)&memory_scope + 3));
      Function::RegisterExecutionModelLimitation
                (pFVar5,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                         *)&execution_scope);
      std::
      function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
      ::~function((function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                   *)&execution_scope);
    }
    error = Instruction::word(_result_type,1);
    error_1 = Instruction::word(_result_type,2);
    error_2 = ValidateExecutionScope((ValidationState_t *)inst_local,_result_type,error);
    if (error_2 != SPV_SUCCESS) {
      return error_2;
    }
    memory_scope_1 = ValidateMemoryScope((ValidationState_t *)inst_local,_result_type,error_1);
    if (memory_scope_1 != SPV_SUCCESS) {
      return memory_scope_1;
    }
    sVar4 = ValidateMemorySemantics((ValidationState_t *)inst_local,_result_type,2,error_1);
  }
  else if (local_24 == OpMemoryBarrier) {
    error_4 = Instruction::word(_result_type,1);
    local_68 = ValidateMemoryScope((ValidationState_t *)inst_local,_result_type,error_4);
    if (local_68 != SPV_SUCCESS) {
      return local_68;
    }
    sVar4 = ValidateMemorySemantics((ValidationState_t *)inst_local,_result_type,1,error_4);
  }
  else {
    if (local_24 == OpNamedBarrierInitialize) {
      OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_28);
      if (OVar2 != OpTypeNamedBarrier) {
        ValidationState_t::diag
                  (&local_248,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        pcStack_250 = spvOpcodeString(local_24);
        pDVar6 = DiagnosticStream::operator<<(&local_248,&stack0xfffffffffffffdb0);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [48])": expected Result Type to be OpTypeNamedBarrier")
        ;
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        DiagnosticStream::~DiagnosticStream(&local_248);
        return __local._4_4_;
      }
      local_254 = ValidationState_t::GetOperandTypeId
                            ((ValidationState_t *)inst_local,_result_type,2);
      bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_254);
      if ((bVar1) &&
         (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_254),
         uVar3 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_430,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pcStack_438 = spvOpcodeString(local_24);
      pDVar6 = DiagnosticStream::operator<<(&local_430,&stack0xfffffffffffffbc8);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [45])": expected Subgroup Count to be a 32-bit int");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_430);
      return __local._4_4_;
    }
    if (local_24 != OpMemoryNamedBarrier) {
      return SPV_SUCCESS;
    }
    local_43c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,0);
    OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_43c);
    if (OVar2 != OpTypeNamedBarrier) {
      ValidationState_t::diag
                (&local_618,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      _error_5 = spvOpcodeString(local_24);
      pDVar6 = DiagnosticStream::operator<<(&local_618,(char **)&error_5);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [58])
                                 ": expected Named Barrier to be of type OpTypeNamedBarrier");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_618);
      return __local._4_4_;
    }
    uVar3 = Instruction::word(_result_type,2);
    sVar4 = ValidateMemoryScope((ValidationState_t *)inst_local,_result_type,uVar3);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = ValidateMemorySemantics((ValidationState_t *)inst_local,_result_type,2,uVar3);
  }
  if (sVar4 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar4;
}

Assistant:

spv_result_t BarriersPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpControlBarrier: {
      if (_.version() < SPV_SPIRV_VERSION_WORD(1, 3)) {
        _.function(inst->function()->id())
            ->RegisterExecutionModelLimitation(
                [](spv::ExecutionModel model, std::string* message) {
                  if (model != spv::ExecutionModel::TessellationControl &&
                      model != spv::ExecutionModel::GLCompute &&
                      model != spv::ExecutionModel::Kernel &&
                      model != spv::ExecutionModel::TaskNV &&
                      model != spv::ExecutionModel::MeshNV) {
                    if (message) {
                      *message =
                          "OpControlBarrier requires one of the following "
                          "Execution "
                          "Models: TessellationControl, GLCompute, Kernel, "
                          "MeshNV or TaskNV";
                    }
                    return false;
                  }
                  return true;
                });
      }

      const uint32_t execution_scope = inst->word(1);
      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpMemoryBarrier: {
      const uint32_t memory_scope = inst->word(1);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 1, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpNamedBarrierInitialize: {
      if (_.GetIdOpcode(result_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Result Type to be OpTypeNamedBarrier";
      }

      const uint32_t subgroup_count_type = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(subgroup_count_type) ||
          _.GetBitWidth(subgroup_count_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Subgroup Count to be a 32-bit int";
      }
      break;
    }

    case spv::Op::OpMemoryNamedBarrier: {
      const uint32_t named_barrier_type = _.GetOperandTypeId(inst, 0);
      if (_.GetIdOpcode(named_barrier_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Named Barrier to be of type OpTypeNamedBarrier";
      }

      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}